

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_destructor.h
# Opt level: O0

void __thiscall
leveldb::NoDestructor<leveldb::(anonymous_namespace)::BytewiseComparatorImpl>::NoDestructor<>
          (NoDestructor<leveldb::(anonymous_namespace)::BytewiseComparatorImpl> *this)

{
  BytewiseComparatorImpl *in_RDI;
  
  memset(in_RDI,0,8);
  anon_unknown_2::BytewiseComparatorImpl::BytewiseComparatorImpl(in_RDI);
  return;
}

Assistant:

explicit NoDestructor(ConstructorArgTypes&&... constructor_args) {
    static_assert(sizeof(instance_storage_) >= sizeof(InstanceType),
                  "instance_storage_ is not large enough to hold the instance");
    static_assert(
        alignof(decltype(instance_storage_)) >= alignof(InstanceType),
        "instance_storage_ does not meet the instance's alignment requirement");
    new (&instance_storage_)
        InstanceType(std::forward<ConstructorArgTypes>(constructor_args)...);
  }